

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth_kbd_packet.c
# Opt level: O2

int userauth_keyboard_interactive_decode_info_request(LIBSSH2_SESSION *session)

{
  int iVar1;
  LIBSSH2_USERAUTH_KBDINT_PROMPT *pLVar2;
  LIBSSH2_USERAUTH_KBDINT_RESPONSE *pLVar3;
  char *errmsg;
  uchar *out;
  ulong uVar4;
  long lVar5;
  uchar packet_type;
  uint32_t tmp_u32;
  string_buf decoded;
  size_t language_tag_len;
  uchar *language_tag;
  
  decoded.data = session->userauth_kybd_data;
  decoded.len = session->userauth_kybd_data_len;
  decoded.dataptr = decoded.data;
  if (decoded.len < 0x11) {
    errmsg = "userauth keyboard data buffer too small to get length";
    goto LAB_001292bd;
  }
  _libssh2_get_byte(&decoded,&packet_type);
  iVar1 = _libssh2_copy_string
                    (session,&decoded,&session->userauth_kybd_auth_name,
                     &session->userauth_kybd_auth_name_len);
  if (iVar1 == -1) {
    errmsg = "Unable to decode keyboard-interactive \'name\' request field";
  }
  else {
    iVar1 = _libssh2_copy_string
                      (session,&decoded,&session->userauth_kybd_auth_instruction,
                       &session->userauth_kybd_auth_instruction_len);
    if (iVar1 == -1) {
      errmsg = "Unable to decode keyboard-interactive \'instruction\' request field";
    }
    else {
      iVar1 = _libssh2_get_string(&decoded,&language_tag,&language_tag_len);
      if (iVar1 == -1) {
        errmsg = "Unable to decode keyboard-interactive \'language tag\' request field";
      }
      else {
        iVar1 = _libssh2_get_u32(&decoded,&tmp_u32);
        if (iVar1 == -1) {
          errmsg = "Unable to decode keyboard-interactive number of keyboard prompts";
LAB_001292bd:
          iVar1 = -0x26;
          goto LAB_00129377;
        }
        uVar4 = (ulong)tmp_u32;
        session->userauth_kybd_num_prompts = tmp_u32;
        if (100 < uVar4) {
          errmsg = "Too many replies for keyboard-interactive prompts";
          iVar1 = -0x29;
          goto LAB_00129377;
        }
        if (uVar4 == 0) {
          return 0;
        }
        pLVar2 = (LIBSSH2_USERAUTH_KBDINT_PROMPT *)_libssh2_calloc(session,uVar4 * 0x18);
        session->userauth_kybd_prompts = pLVar2;
        if (pLVar2 == (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0) {
          errmsg = "Unable to allocate memory for keyboard-interactive prompts array";
        }
        else {
          pLVar3 = (LIBSSH2_USERAUTH_KBDINT_RESPONSE *)
                   _libssh2_calloc(session,(ulong)session->userauth_kybd_num_prompts << 4);
          session->userauth_kybd_responses = pLVar3;
          if (pLVar3 != (LIBSSH2_USERAUTH_KBDINT_RESPONSE *)0x0) {
            lVar5 = 8;
            uVar4 = 0xffffffffffffffff;
            do {
              uVar4 = uVar4 + 1;
              if (session->userauth_kybd_num_prompts <= uVar4) {
                return 0;
              }
              iVar1 = _libssh2_copy_string
                                (session,&decoded,
                                 (uchar **)((long)session->userauth_kybd_prompts + lVar5 + -8),
                                 (size_t *)((long)&session->userauth_kybd_prompts->text + lVar5));
              if (iVar1 == -1) {
                errmsg = "Unable to decode keyboard-interactive prompt message";
                goto LAB_00129375;
              }
              out = (uchar *)((long)&session->userauth_kybd_prompts->length + lVar5);
              lVar5 = lVar5 + 0x18;
              iVar1 = _libssh2_get_boolean(&decoded,out);
            } while (iVar1 != -1);
            errmsg = "Unable to decode user auth keyboard prompt echo";
            goto LAB_001292bd;
          }
          errmsg = "Unable to allocate memory for keyboard-interactive responses array";
        }
      }
    }
  }
LAB_00129375:
  iVar1 = -6;
LAB_00129377:
  _libssh2_error(session,iVar1,errmsg);
  return -1;
}

Assistant:

int userauth_keyboard_interactive_decode_info_request(LIBSSH2_SESSION *session)
{
    unsigned char *language_tag;
    size_t language_tag_len;
    unsigned int i;
    unsigned char packet_type;
    uint32_t tmp_u32;

    struct string_buf decoded;

    decoded.data = session->userauth_kybd_data;
    decoded.dataptr = session->userauth_kybd_data;
    decoded.len = session->userauth_kybd_data_len;

    if(session->userauth_kybd_data_len < 17) {
        _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                       "userauth keyboard data buffer too small "
                       "to get length");
        return -1;
    }

    /* byte      SSH_MSG_USERAUTH_INFO_REQUEST */
    _libssh2_get_byte(&decoded, &packet_type);

    /* string    name (ISO-10646 UTF-8) */
    if(_libssh2_copy_string(session, &decoded,
                            &session->userauth_kybd_auth_name,
                            &session->userauth_kybd_auth_name_len) == -1) {
        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                       "Unable to decode "
                       "keyboard-interactive 'name' "
                       "request field");
        return -1;
    }

    /* string    instruction (ISO-10646 UTF-8) */
    if(_libssh2_copy_string(session, &decoded,
                            &session->userauth_kybd_auth_instruction,
                            &session->userauth_kybd_auth_instruction_len)
       == -1) {
        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                       "Unable to decode "
                       "keyboard-interactive 'instruction' "
                       "request field");
        return -1;
    }

    /* string    language tag (as defined in [RFC-3066]) */
    if(_libssh2_get_string(&decoded, &language_tag,
                           &language_tag_len) == -1) {
        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                       "Unable to decode "
                       "keyboard-interactive 'language tag' "
                       "request field");
        return -1;
    }

    /* int       num-prompts */
    if(_libssh2_get_u32(&decoded, &tmp_u32) == -1 ||
       (session->userauth_kybd_num_prompts = tmp_u32) != tmp_u32) {
        _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                       "Unable to decode "
                       "keyboard-interactive number of keyboard prompts");
        return -1;
    }

    if(session->userauth_kybd_num_prompts > 100) {
        _libssh2_error(session, LIBSSH2_ERROR_OUT_OF_BOUNDARY,
                       "Too many replies for "
                       "keyboard-interactive prompts");
        return -1;
    }

    if(session->userauth_kybd_num_prompts == 0) {
        return 0;
    }

    session->userauth_kybd_prompts =
        LIBSSH2_CALLOC(session,
                       sizeof(LIBSSH2_USERAUTH_KBDINT_PROMPT) *
                       session->userauth_kybd_num_prompts);
    if(!session->userauth_kybd_prompts) {
        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                       "Unable to allocate memory for "
                       "keyboard-interactive prompts array");
        return -1;
    }

    session->userauth_kybd_responses =
        LIBSSH2_CALLOC(session,
                       sizeof(LIBSSH2_USERAUTH_KBDINT_RESPONSE) *
                       session->userauth_kybd_num_prompts);
    if(!session->userauth_kybd_responses) {
        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                       "Unable to allocate memory for "
                       "keyboard-interactive responses array");
        return -1;
    }

    for(i = 0; i < session->userauth_kybd_num_prompts; i++) {
        /* string    prompt[1] (ISO-10646 UTF-8) */
        if(_libssh2_copy_string(session, &decoded,
                                &session->userauth_kybd_prompts[i].text,
                                &session->userauth_kybd_prompts[i].length)
           == -1) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                           "Unable to decode "
                           "keyboard-interactive prompt message");
            return -1;
        }

        /* boolean   echo[1] */
        if(_libssh2_get_boolean(&decoded,
                                &session->userauth_kybd_prompts[i].echo)
           == -1) {
            _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                           "Unable to decode "
                           "user auth keyboard prompt echo");
            return -1;
        }
    }

    return 0;
}